

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::character::scan(character *this,location *loc)

{
  bool bVar1;
  char_type_conflict cVar2;
  location *in_RSI;
  region *in_RDI;
  location first;
  location *in_stack_ffffffffffffff68;
  location *in_stack_ffffffffffffff70;
  location *this_00;
  region *this_01;
  location *in_stack_ffffffffffffff90;
  location *in_stack_ffffffffffffff98;
  region *in_stack_ffffffffffffffa0;
  
  this_01 = in_RDI;
  bVar1 = location::eof(in_stack_ffffffffffffff70);
  if (bVar1) {
    region::region(in_stack_ffffffffffffffa0);
  }
  else {
    cVar2 = location::current(in_stack_ffffffffffffff68);
    if (cVar2 == *(char_type_conflict *)
                  &(in_RSI->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi) {
      this_00 = (location *)&stack0xffffffffffffffa0;
      location::location(in_stack_ffffffffffffff90,in_RSI);
      location::advance((location *)this_01,(size_t)in_RDI);
      region::region(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      location::~location(this_00);
    }
    else {
      region::region(in_stack_ffffffffffffffa0);
    }
  }
  return this_01;
}

Assistant:

TOML11_INLINE region character::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    if(loc.current() == this->value_)
    {
        const auto first = loc;
        loc.advance(1);
        return region(first, loc);
    }
    return region{};
}